

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall ShadingPass::ShadingPass(ShadingPass *this,uint width,uint height)

{
  uint uVar1;
  undefined4 local_118;
  allocator<char> local_111;
  uint attachments [1];
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  uint local_18;
  uint local_14;
  uint height_local;
  uint width_local;
  ShadingPass *this_local;
  
  local_18 = height;
  local_14 = width;
  _height_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"shaders/final.vert",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"shaders/draw.frag",&local_71);
  Shader::Shader(&this->draw_program,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"shaders/final.vert",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"shaders/final.frag",&local_c1);
  Shader::Shader(&this->shading_program,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"shaders/skybox.vert",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)attachments,"shaders/skybox.frag",&local_111);
  Shader::Shader(&this->skybox_program,&local_e8,(string *)attachments);
  std::__cxx11::string::~string((string *)attachments);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_118 = 0x8ce0;
  (*gl3wProcs.ptr[0xac])(1,&this->fbo);
  (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
  uVar1 = create_texture(local_14,local_18,0x8815,0x1907);
  this->shading_tex = uVar1;
  (*gl3wProcs.ptr[0xa7])(0x8d40,0x8ce0,0xde1,(ulong)this->shading_tex,0);
  (*gl3wProcs.ptr[0x88])(1,&local_118);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  uVar1 = createSkyboxVAO();
  this->cube_vao = uVar1;
  this->ambient_intensity = 1.0;
  this->shadow_bias = 1e-08;
  this->use_pcf = true;
  this->pcf_radius = 3.0;
  this->frame_num = 0;
  this->skybox_choice = 0;
  return;
}

Assistant:

ShadingPass::ShadingPass(unsigned int width, unsigned int height)
    : draw_program("shaders/final.vert", "shaders/draw.frag")
    , shading_program("shaders/final.vert", "shaders/final.frag")
    , skybox_program("shaders/skybox.vert", "shaders/skybox.frag")
{
    unsigned int attachments[1] = { GL_COLOR_ATTACHMENT0 };
    glGenFramebuffers(1, &fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    shading_tex = create_texture(width, height, GL_RGB32F, GL_RGB);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, shading_tex, 0);
    glDrawBuffers(1, attachments);
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    cube_vao = createSkyboxVAO();

    ambient_intensity = 1.f;
    shadow_bias = 1e-8;
    use_pcf = true;
    pcf_radius = 3;

    frame_num = 0;

    skybox_choice = 0;
}